

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  undefined4 *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  ImVec2 *local_70;
  ImVec2 *local_50;
  int local_44;
  int local_40;
  int local_3c;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  int local_20;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 2));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2e));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x48));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xec));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xef));
  local_50 = (ImVec2 *)(in_RDI + 0xf1);
  do {
    ImVec2::ImVec2(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (ImVec2 *)(in_RDI + 0xfb));
  local_70 = (ImVec2 *)(in_RDI + 0x117);
  do {
    ImVec2::ImVec2(local_70);
    local_70 = local_70 + 1;
  } while (local_70 != (ImVec2 *)(in_RDI + 0x121));
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)(in_RDI + 0x552));
  memset(in_RDI,0,0x1558);
  *in_RDI = 0;
  in_RDI[1] = 0;
  ImVec2::ImVec2(local_10,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 2) = local_10[0];
  in_RDI[4] = 0x3c888889;
  in_RDI[5] = 0x40a00000;
  *(char **)(in_RDI + 6) = "imgui.ini";
  *(char **)(in_RDI + 8) = "imgui_log.txt";
  in_RDI[10] = 0x3e99999a;
  in_RDI[0xb] = 0x40c00000;
  for (local_20 = 0; local_20 < 0x16; local_20 = local_20 + 1) {
    in_RDI[(long)local_20 + 0xd] = 0xffffffff;
  }
  in_RDI[0x23] = 0x3e8ccccd;
  in_RDI[0x24] = 0x3d4ccccd;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  in_RDI[0x2a] = 0x3f800000;
  *(undefined8 *)(in_RDI + 0x2c) = 0;
  *(undefined1 *)(in_RDI + 0x2b) = 0;
  ImVec2::ImVec2(&local_28,1.0,1.0);
  *(ImVec2 *)(in_RDI + 0x2e) = local_28;
  *(undefined1 *)(in_RDI + 0x30) = 0;
  *(undefined1 *)((long)in_RDI + 0xc1) = 0;
  *(undefined1 *)((long)in_RDI + 0xc2) = 1;
  *(undefined1 *)(in_RDI + 0x31) = 1;
  *(undefined1 *)((long)in_RDI + 0xc5) = 0;
  in_RDI[0x32] = 0x42700000;
  *(undefined8 *)(in_RDI + 0x36) = 0;
  *(undefined8 *)(in_RDI + 0x34) = 0;
  *(undefined8 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x3a) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(code **)(in_RDI + 0x3e) = GetClipboardTextFn_DefaultImpl;
  *(code **)(in_RDI + 0x40) = SetClipboardTextFn_DefaultImpl;
  *(undefined8 *)(in_RDI + 0x42) = 0;
  *(code **)(in_RDI + 0x44) = ImeSetInputScreenPosFn_DefaultImpl;
  *(undefined8 *)(in_RDI + 0x46) = 0;
  ImVec2::ImVec2(&local_30,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x48) = local_30;
  ImVec2::ImVec2(&local_38,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0xef) = local_38;
  in_RDI[0xc] = 0x40c00000;
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    in_RDI[(long)local_3c + 0x112] = 0xbf800000;
    in_RDI[(long)local_3c + 0x10d] = 0xbf800000;
  }
  for (local_40 = 0; local_40 < 0x200; local_40 = local_40 + 1) {
    in_RDI[(long)local_40 + 0x326] = 0xbf800000;
    in_RDI[(long)local_40 + 0x126] = 0xbf800000;
  }
  for (local_44 = 0; local_44 < 0x15; local_44 = local_44 + 1) {
    in_RDI[(long)local_44 + 0x526] = 0xbf800000;
  }
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));
    IM_ASSERT(IM_ARRAYSIZE(ImGuiIO::MouseDown) == ImGuiMouseButton_COUNT && IM_ARRAYSIZE(ImGuiIO::MouseClicked) == ImGuiMouseButton_COUNT); // Our pre-C++11 IM_STATIC_ASSERT() macros triggers warning on modern compilers so we don't use it here.

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f / 60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.275f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;
    ConfigMemoryCompactTimer = 60.0f;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}